

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

int __thiscall
Centaurus::DFA<char>::add_state
          (DFA<char> *this,set<int,_std::less<int>,_std::allocator<int>_> *label,bool long_flag)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  IndexVector *pIVar5;
  iterator a;
  iterator b;
  bool local_91;
  IndexVector local_60;
  int *local_40;
  _Rb_tree_const_iterator<int> local_38;
  _Rb_tree_const_iterator<int> local_30;
  uint local_28;
  bool local_21;
  uint i;
  bool long_flag_local;
  set<int,_std::less<int>,_std::allocator<int>_> *label_local;
  DFA<char> *this_local;
  
  local_28 = 0;
  local_21 = long_flag;
  _i = label;
  label_local = (set<int,_std::less<int>,_std::allocator<int>_> *)this;
  while( true ) {
    uVar1 = (ulong)local_28;
    sVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
            size(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states);
    if (sVar2 <= uVar1) {
      a = std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin(_i);
      b = std::set<int,_std::less<int>,_std::allocator<int>_>::cend(_i);
      IndexVector::IndexVector<std::_Rb_tree_const_iterator<int>>
                (&local_60,(_Rb_tree_const_iterator<int>)a._M_node,
                 (_Rb_tree_const_iterator<int>)b._M_node);
      std::vector<Centaurus::DFAState<char>,std::allocator<Centaurus::DFAState<char>>>::
      emplace_back<Centaurus::IndexVector,bool&>
                ((vector<Centaurus::DFAState<char>,std::allocator<Centaurus::DFAState<char>>> *)
                 &(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,&local_60,&local_21);
      IndexVector::~IndexVector(&local_60);
      sVar2 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
              size(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states);
      return (int)sVar2 + -1;
    }
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(_i);
    pvVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
             operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(ulong)local_28)
    ;
    pIVar5 = NFABaseState<char,_Centaurus::IndexVector>::label
                       (&pvVar4->super_NFABaseState<char,_Centaurus::IndexVector>);
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      (&pIVar5->super_vector<int,_std::allocator<int>_>);
    local_91 = false;
    if (sVar3 == sVar2) {
      local_30._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin(_i);
      local_38._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::cend(_i);
      pvVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
               operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,
                          (ulong)local_28);
      pIVar5 = NFABaseState<char,_Centaurus::IndexVector>::label
                         (&pvVar4->super_NFABaseState<char,_Centaurus::IndexVector>);
      local_40 = (int *)std::vector<int,_std::allocator<int>_>::cbegin
                                  (&pIVar5->super_vector<int,_std::allocator<int>_>);
      local_91 = std::
                 equal<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                           (local_30,local_38,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            )local_40);
    }
    if (local_91 != false) break;
    local_28 = local_28 + 1;
  }
  pvVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
           operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(ulong)local_28);
  DFAState<char>::set_long(pvVar4,(bool)(local_21 & 1));
  return local_28;
}

Assistant:

int add_state(const std::set<int>& label, bool long_flag = false)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label.size() == m_states[i].label().size() && std::equal(label.cbegin(), label.cend(), m_states[i].label().cbegin()))
			{
                m_states[i].set_long(long_flag);
				return i;
			}
		}
		m_states.emplace_back(IndexVector(label.cbegin(), label.cend()), long_flag);
		return m_states.size() - 1;
	}